

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  KeyInfo *pKVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  Mem *pMem2;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  u32 serial_type;
  u32 szHdr1;
  Mem mem1;
  uint local_b8;
  uint local_b4;
  void *local_b0;
  uint local_a4;
  UnpackedRecord *local_a0;
  uint local_94;
  ulong local_90;
  u8 *local_88;
  double local_80;
  long local_78;
  long local_70;
  MemValue local_68;
  undefined2 local_60;
  u8 local_5e;
  uint local_5c;
  long local_58;
  sqlite3 *local_40;
  
  pMem2 = pPKey2->aMem;
  local_b4 = nKey1;
  if (bSkip == 0) {
    if (*pKey1 < '\0') {
      bVar6 = sqlite3GetVarint32((uchar *)pKey1,&local_a4);
      uVar11 = (uint)bVar6;
    }
    else {
      uVar11 = 1;
      local_a4 = (int)*pKey1;
    }
    uVar14 = 0;
    uVar12 = local_a4;
  }
  else {
    if (*(char *)((long)pKey1 + 1) < '\0') {
      bVar6 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
      uVar11 = bVar6 + 1;
    }
    else {
      uVar11 = 2;
      local_68.nZero = (int)*(char *)((long)pKey1 + 1);
    }
    local_a4 = (uint)*pKey1;
    if ((ulong)(uint)local_68.nZero < 0x80) {
      uVar12 = (uint)""[(uint)local_68.nZero];
    }
    else {
      uVar12 = local_68.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar14 = 1;
    uVar12 = uVar12 + local_a4;
  }
  uVar5 = local_a4;
  uVar13 = (ulong)uVar12;
  if (local_b4 < uVar12) {
    iVar10 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13ac7,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    pPKey2->errCode = '\v';
  }
  else {
    local_88 = &pPKey2->errCode;
    uVar12 = 0;
    local_a0 = pPKey2;
LAB_0014e847:
    uVar2 = pMem2->flags;
    if ((uVar2 & 4) == 0) {
      if ((uVar2 & 8) != 0) {
        local_b8 = (uint)*(byte *)((long)pKey1 + (ulong)uVar11);
        uVar7 = 1;
        if (9 < local_b8) goto LAB_0014ed3e;
        uVar15 = (uint)*(byte *)((long)pKey1 + (ulong)uVar11);
        if (uVar15 == 0) {
          uVar7 = 0xffffffff;
          goto LAB_0014ed3e;
        }
        local_b0 = (void *)CONCAT44(local_b0._4_4_,uVar14);
        local_90 = uVar13;
        sqlite3VdbeSerialGet((uchar *)((uVar13 & 0xffffffff) + (long)pKey1),uVar15,(Mem *)&local_68)
        ;
        dVar1 = (pMem2->u).r;
        uVar13 = local_90;
        uVar14 = (uint)local_b0;
        if (uVar15 != 7) {
          local_78 = CONCAT44(local_68.i._4_4_,local_68.nZero);
          local_80 = dVar1;
          uVar7 = (uint)(dVar1 < (double)local_78);
          if ((double)local_78 < dVar1) {
            uVar7 = 0xffffffff;
          }
          goto LAB_0014ed3e;
        }
        if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) {
          uVar7 = 0xffffffff;
          goto LAB_0014ed3e;
        }
        if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_0014ed3e;
        goto LAB_0014ed3b;
      }
      uVar9 = (ulong)uVar11;
      if ((uVar2 & 2) == 0) {
        uVar7 = (uint)*(byte *)((long)pKey1 + uVar9);
        if ((uVar2 & 0x10) == 0) {
          local_b8 = uVar7;
          uVar7 = (uint)(uVar7 != 0);
        }
        else {
          if ((char)*(byte *)((long)pKey1 + uVar9) < '\0') {
            local_b0 = pKey1;
            sqlite3GetVarint32((uchar *)(uVar9 + (long)pKey1),&local_b8);
            pPKey2 = local_a0;
            pKey1 = local_b0;
            uVar7 = local_b8;
          }
          local_b8 = uVar7;
          uVar7 = 0xffffffff;
          if ((local_b8 & 1) == 0 && 0xb < local_b8) {
            local_b0 = (void *)CONCAT44(local_b0._4_4_,uVar14);
            uVar7 = local_b8 - 0xc >> 1;
            uVar15 = (int)uVar13 + uVar7;
            if (local_b4 < uVar15) {
              local_94 = 0;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b30,
                          "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
              local_a0->errCode = '\v';
LAB_0014ec8b:
              uVar14 = (uint)local_b0;
            }
            else {
              if ((pMem2->flags & 0x4000) == 0) {
                uVar12 = pMem2->n;
                uVar14 = uVar12;
                if ((int)uVar7 < (int)uVar12) {
                  uVar14 = uVar7;
                }
                uVar14 = memcmp((void *)((uVar13 & 0xffffffff) + (long)pKey1),pMem2->z,
                                (long)(int)uVar14);
                uVar12 = uVar7 - uVar12;
                if (uVar14 != 0) {
                  uVar12 = uVar14;
                }
                goto LAB_0014ec8b;
              }
              if (local_b8 - 0xc != 0) {
                uVar9 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar9 + (uVar13 & 0xffffffff)) != '\0') {
                    uVar12 = 1;
                    goto LAB_0014ec9a;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
              }
              uVar12 = uVar7 - (pMem2->u).nZero;
            }
LAB_0014ec9a:
            iVar10 = 1;
            pPKey2 = local_a0;
            uVar7 = uVar12;
            if (local_b4 < uVar15) goto LAB_0014edd0;
          }
        }
        goto LAB_0014ed3e;
      }
      uVar7 = (int)*(char *)((long)pKey1 + uVar9);
      if (*(char *)((long)pKey1 + uVar9) < '\0') {
        local_b0 = pKey1;
        sqlite3GetVarint32((uchar *)(uVar9 + (long)pKey1),&local_b8);
        pPKey2 = local_a0;
        pKey1 = local_b0;
        uVar7 = local_b8;
      }
      local_b8 = uVar7;
      uVar7 = 0xffffffff;
      if ((local_b8 < 0xc) || (uVar7 = 1, (local_b8 & 1) == 0)) goto LAB_0014ed3e;
      local_5c = local_b8 - 0xc >> 1;
      if ((local_5c + (int)uVar13 <= local_b4) &&
         (pKVar3 = pPKey2->pKeyInfo, (int)uVar14 < (int)(uint)pKVar3->nAllField)) {
        if (pKVar3->aColl[(int)uVar14] == (CollSeq *)0x0) {
          uVar12 = pMem2->n;
          uVar7 = local_5c - uVar12;
          if ((int)local_5c < (int)uVar12) {
            uVar12 = local_5c;
          }
          uVar12 = memcmp((void *)((uVar13 & 0xffffffff) + (long)pKey1),pMem2->z,(long)(int)uVar12);
          pPKey2 = local_a0;
          if (uVar12 != 0) {
            uVar7 = uVar12;
          }
        }
        else {
          local_5e = pKVar3->enc;
          local_40 = pKVar3->db;
          local_60 = 2;
          local_58 = (uVar13 & 0xffffffff) + (long)pKey1;
          uVar7 = vdbeCompareMemString((Mem *)&local_68,pMem2,pKVar3->aColl[(int)uVar14],local_88);
          pPKey2 = local_a0;
        }
        goto LAB_0014ed3e;
      }
      local_94 = 0;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b12,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      local_a0->errCode = '\v';
      iVar10 = 1;
      pPKey2 = local_a0;
      goto LAB_0014edd0;
    }
    bVar6 = *(byte *)((long)pKey1 + (ulong)uVar11);
    local_b8 = (uint)bVar6;
    uVar7 = 1;
    if (9 < local_b8) goto LAB_0014ed3e;
    uVar15 = (uint)bVar6;
    uVar7 = 0xffffffff;
    if (uVar15 == 0) goto LAB_0014ed3e;
    uVar9 = uVar13 & 0xffffffff;
    if (uVar15 == 7) {
      serialGet((uchar *)(uVar9 + (long)pKey1),7,(Mem *)&local_68);
      local_70 = (pMem2->u).i;
      uVar7 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_70);
      if ((double)local_70 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
        uVar7 = 1;
      }
      goto LAB_0014ed3e;
    }
    switch(bVar6) {
    case 1:
      uVar9 = (ulong)*(char *)((long)pKey1 + uVar9);
      goto LAB_0014ed2d;
    case 2:
      uVar8 = (long)*(char *)((long)pKey1 + uVar9) << 8;
      uVar9 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1);
      break;
    case 3:
      uVar8 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 8 |
              (long)*(char *)((long)pKey1 + uVar9) << 0x10;
      uVar9 = (ulong)*(byte *)((long)pKey1 + uVar9 + 2);
      break;
    case 4:
      uVar8 = (ulong)*(byte *)((long)pKey1 + uVar9 + 2) << 8 |
              (long)(int)((uint)*(byte *)((long)pKey1 + uVar9) << 0x18) |
              (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 0x10;
      uVar9 = (ulong)*(byte *)((long)pKey1 + uVar9 + 3);
      break;
    case 5:
      uVar15 = *(uint *)((long)pKey1 + uVar9 + 2);
      uVar8 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18);
      uVar9 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar9),
                                         *(undefined1 *)((long)pKey1 + uVar9 + 1)) << 0x20;
      break;
    case 6:
      uVar9 = *(ulong *)((long)pKey1 + uVar9);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      goto LAB_0014ed2d;
    default:
      uVar9 = (ulong)(uVar15 - 8);
      goto LAB_0014ed2d;
    }
    uVar9 = uVar9 | uVar8;
LAB_0014ed2d:
    if ((pMem2->u).i <= (long)uVar9) {
      if ((pMem2->u).i < (long)uVar9) {
        uVar12 = 1;
      }
LAB_0014ed3b:
      uVar7 = uVar12;
    }
LAB_0014ed3e:
    if (uVar7 == 0) {
      uVar14 = uVar14 + 1;
      if (uVar14 == pPKey2->nField) {
        uVar12 = 0;
        iVar10 = 2;
      }
      else {
        uVar9 = (ulong)local_b8;
        if (uVar9 < 0x80) {
          uVar7 = (uint)""[uVar9];
        }
        else {
          uVar7 = local_b8 - 0xc >> 1;
        }
        iVar10 = 1;
        if (0x7f < local_b8) {
          do {
            iVar10 = iVar10 + 1;
            bVar4 = 0x3fff < uVar9;
            uVar9 = uVar9 >> 7;
          } while (bVar4);
        }
        pMem2 = pMem2 + 1;
        uVar11 = uVar11 + iVar10;
        iVar10 = 0;
        uVar12 = 0;
        uVar13 = (ulong)(uVar7 + (int)uVar13);
      }
    }
    else {
      local_94 = -uVar7;
      if (pPKey2->pKeyInfo->aSortOrder[(int)uVar14] == '\0') {
        local_94 = uVar7;
      }
      iVar10 = 1;
      uVar12 = local_94;
    }
LAB_0014edd0:
    if (iVar10 == 0) {
      if ((uVar5 <= uVar11) || (local_b4 < (uint)uVar13)) goto LAB_0014ee8a;
      goto LAB_0014e847;
    }
    if (iVar10 != 2) {
      return local_94;
    }
LAB_0014ee8a:
    pPKey2->eqSeen = '\x01';
    iVar10 = (int)pPKey2->default_rc;
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & MEM_Int ){
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}